

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>,_void>
     ::serialize<OutputStream>
               (unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
                *opt,OutputStream *ostream)

{
  bool bVar1;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *in_RSI;
  uint6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 uVar2;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
                      *)0x19e128);
  if (bVar1) {
    uVar2 = 1;
    serialize<unsigned_char,OutputStream>
              ((uchar *)in_RSI,
               (OutputStream *)
               CONCAT17(1,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
    std::
    unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
    ::operator*((unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
                 *)in_RSI);
    serialize<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,OutputStream>
              (in_RSI,(OutputStream *)
                      CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)))
    ;
  }
  else {
    serialize<unsigned_char,OutputStream>
              ((uchar *)in_RSI,
               (OutputStream *)CONCAT17(in_stack_ffffffffffffffef,(uint7)in_stack_ffffffffffffffe8))
    ;
  }
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }